

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O2

void * chachapoly_ctx_alloc(void)

{
  mbedtls_chachapoly_context *ctx;
  
  ctx = (mbedtls_chachapoly_context *)calloc(1,0xf0);
  if (ctx != (mbedtls_chachapoly_context *)0x0) {
    mbedtls_chachapoly_init(ctx);
  }
  return ctx;
}

Assistant:

static void * chachapoly_ctx_alloc( void )
{
    mbedtls_chachapoly_context *ctx;
    ctx = mbedtls_calloc( 1, sizeof( mbedtls_chachapoly_context ) );

    if( ctx == NULL )
        return( NULL );

    mbedtls_chachapoly_init( ctx );

    return( ctx );
}